

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

void __thiscall foxxll::disk_config::parse_fileio(disk_config *this)

{
  string *this_00;
  int iVar1;
  long lVar2;
  ulong uVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  pointer str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  eq;
  char *endp;
  ostringstream msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  param;
  string paramstr;
  string local_220 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  char *local_1e8;
  long *local_1e0 [2];
  long local_1d0 [45];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  this_00 = &this->io_impl;
  lVar2 = std::__cxx11::string::find_first_not_of((char)this_00,0x20);
  if (lVar2 != 0) {
    std::__cxx11::string::substr((ulong)local_1e0,(ulong)this_00);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_1e0);
    if (local_1e0[0] != local_1d0) {
      operator_delete(local_1e0[0],local_1d0[0] + 1);
    }
  }
  lVar2 = std::__cxx11::string::find((char)this_00,0x20);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)this_00);
    std::__cxx11::string::substr((ulong)local_1e0,(ulong)this_00);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_1e0);
    if (local_1e0[0] != local_1d0) {
      operator_delete(local_1e0[0],local_1d0[0] + 1);
    }
    tlx::split(&local_68,' ',&local_50,0xffffffffffffffff);
    if (local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      str = local_68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        tlx::split(&local_200,'=',str,2,2);
        iVar1 = std::__cxx11::string::compare((char *)str);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)str);
          if (((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)str), iVar1 == 0)) ||
             (iVar1 = std::__cxx11::string::compare
                                ((char *)local_200.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start), iVar1 == 0)) {
            iVar1 = std::__cxx11::string::compare((char *)str);
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare((char *)str);
              if ((iVar1 == 0) ||
                 (iVar1 = std::__cxx11::string::compare
                                    ((char *)(local_200.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 1)),
                 iVar1 == 0)) {
LAB_0014600f:
                this->autogrow = false;
                goto LAB_0014601b;
              }
              iVar1 = std::__cxx11::string::compare
                                ((char *)(local_200.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 1));
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::string::compare
                                  ((char *)(local_200.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 1));
                if (iVar1 == 0) goto LAB_0014600f;
                iVar1 = std::__cxx11::string::compare
                                  ((char *)(local_200.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 1));
                if (iVar1 != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e0,"Error in ",9);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e0,"void foxxll::disk_config::parse_fileio()",0x28);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0," : ",3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e0,"Invalid parameter \'",0x13);
                  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1e0,(str->_M_dataplus)._M_p,
                                      str->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar4,"\' in disk configuration file.",0x1d);
                  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::stringbuf::str();
                  std::runtime_error::runtime_error(prVar5,local_220);
                  __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
              }
            }
            this->autogrow = true;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)str);
            if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)str), iVar1 == 0)) {
              this->delete_on_exit = true;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)str);
              if (((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)str), iVar1 == 0))
                 || (iVar1 = std::__cxx11::string::compare
                                       ((char *)local_200.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start),
                    iVar1 == 0)) {
                iVar1 = std::__cxx11::string::compare((char *)str);
                if (iVar1 == 0) {
LAB_001460ed:
                  this->direct = DIRECT_ON;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)str);
                  if ((iVar1 == 0) ||
                     (iVar1 = std::__cxx11::string::compare
                                        ((char *)(local_200.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1)),
                     iVar1 == 0)) {
LAB_001460fa:
                    this->direct = DIRECT_OFF;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare
                                      ((char *)(local_200.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + 1));
                    if (iVar1 != 0) {
                      iVar1 = std::__cxx11::string::compare
                                        ((char *)(local_200.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1));
                      if (iVar1 != 0) {
                        iVar1 = std::__cxx11::string::compare
                                          ((char *)(local_200.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1));
                        if (iVar1 == 0) goto LAB_001460fa;
                        iVar1 = std::__cxx11::string::compare
                                          ((char *)(local_200.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1));
                        if (iVar1 != 0) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e0,"Error in ",9);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e0,"void foxxll::disk_config::parse_fileio()"
                                     ,0x28);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e0," : ",3);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e0,"Invalid parameter \'",0x13);
                          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                             ((ostream *)local_1e0,(str->_M_dataplus)._M_p,
                                              str->_M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar4,"\' in disk configuration file.",0x1d);
                          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::__cxx11::stringbuf::str();
                          std::runtime_error::runtime_error(prVar5,local_220);
                          __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                      }
                      goto LAB_001460ed;
                    }
                    this->direct = DIRECT_TRY;
                  }
                }
              }
              else {
                iVar1 = std::__cxx11::string::compare
                                  ((char *)local_200.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
                if (iVar1 == 0) {
                  iVar1 = std::__cxx11::string::compare((char *)this_00);
                  if (iVar1 == 0) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e0,"Error in ",9);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e0,"void foxxll::disk_config::parse_fileio()",0x28)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0," : ",3)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e0,"Parameter \'",0xb);
                    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)local_1e0,(str->_M_dataplus)._M_p,
                                        str->_M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar4,"\' invalid for fileio \'",0x16);
                    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar4,(this->io_impl)._M_dataplus._M_p,
                                        (this->io_impl)._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar4,"\' in disk configuration file.",0x1d);
                    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::__cxx11::stringbuf::str();
                    std::runtime_error::runtime_error(prVar5,local_220);
                    __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  uVar3 = strtoul(local_200.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                                  &local_1e8,10);
                  this->queue = (int)uVar3;
                  if ((local_1e8 != (char *)0x0) && (*local_1e8 != '\0')) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e0,"Error in ",9);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e0,"void foxxll::disk_config::parse_fileio()",0x28)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0," : ",3)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e0,"Invalid parameter \'",0x13);
                    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)local_1e0,(str->_M_dataplus)._M_p,
                                        str->_M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar4,"\' in disk configuration file.",0x1d);
                    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::__cxx11::stringbuf::str();
                    std::runtime_error::runtime_error(prVar5,local_220);
                    __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                }
                else {
                  iVar1 = std::__cxx11::string::compare
                                    ((char *)local_200.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                  if (iVar1 == 0) {
                    iVar1 = std::__cxx11::string::compare((char *)this_00);
                    if (iVar1 != 0) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e0,"Error in ",9);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e0,"void foxxll::disk_config::parse_fileio()",
                                 0x28);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e0," : ",3);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e0,"Parameter \'",0xb);
                      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)local_1e0,(str->_M_dataplus)._M_p,
                                          str->_M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar4,
                                 "\' is only valid for fileio linuxaio in disk configuration file.",
                                 0x3f);
                      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::__cxx11::stringbuf::str();
                      std::runtime_error::runtime_error(prVar5,local_220);
                      __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    uVar3 = strtoul(local_200.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                                    &local_1e8,10);
                    this->queue_length = (int)uVar3;
                    if ((local_1e8 != (char *)0x0) && (*local_1e8 != '\0')) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e0,"Error in ",9);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e0,"void foxxll::disk_config::parse_fileio()",
                                 0x28);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e0," : ",3);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e0,"Invalid parameter \'",0x13);
                      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)local_1e0,(str->_M_dataplus)._M_p,
                                          str->_M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar4,"\' in disk configuration file.",0x1d);
                      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::__cxx11::stringbuf::str();
                      std::runtime_error::runtime_error(prVar5,local_220);
                      __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare
                                      ((char *)local_200.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
                    if ((iVar1 == 0) ||
                       (iVar1 = std::__cxx11::string::compare
                                          ((char *)local_200.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start),
                       iVar1 == 0)) {
                      uVar3 = strtoul(local_200.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                                      &local_1e8,10);
                      this->device_id = (uint)uVar3;
                      if ((local_1e8 != (char *)0x0) && (*local_1e8 != '\0')) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1e0,"Error in ",9);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1e0,"void foxxll::disk_config::parse_fileio()",
                                   0x28);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1e0," : ",3);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1e0,"Invalid parameter \'",0x13);
                        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                           ((ostream *)local_1e0,(str->_M_dataplus)._M_p,
                                            str->_M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar4,"\' in disk configuration file.",0x1d);
                        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::__cxx11::stringbuf::str();
                        std::runtime_error::runtime_error(prVar5,local_220);
                        __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)str);
                      if (iVar1 == 0) {
                        iVar1 = std::__cxx11::string::compare((char *)this_00);
                        if (iVar1 != 0) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e0,"Error in ",9);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e0,"void foxxll::disk_config::parse_fileio()"
                                     ,0x28);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e0," : ",3);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e0,"Parameter \'",0xb);
                          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                             ((ostream *)local_1e0,(str->_M_dataplus)._M_p,
                                              str->_M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar4,"\' invalid for fileio \'",0x16);
                          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                             (poVar4,(this->io_impl)._M_dataplus._M_p,
                                              (this->io_impl)._M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar4,"\' in disk configuration file.",0x1d);
                          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::__cxx11::stringbuf::str();
                          std::runtime_error::runtime_error(prVar5,local_220);
                          __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        this->raw_device = true;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)str);
                        if ((iVar1 != 0) &&
                           (iVar1 = std::__cxx11::string::compare((char *)str), iVar1 != 0)) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e0,"Error in ",9);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e0,"void foxxll::disk_config::parse_fileio()"
                                     ,0x28);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e0," : ",3);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e0,"Invalid optional parameter \'",0x1c);
                          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                             ((ostream *)local_1e0,(str->_M_dataplus)._M_p,
                                              str->_M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar4,"\' in disk configuration file.",0x1d);
                          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::__cxx11::stringbuf::str();
                          std::runtime_error::runtime_error(prVar5,local_220);
                          __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        iVar1 = std::__cxx11::string::compare((char *)this_00);
                        if (((iVar1 != 0) &&
                            (iVar1 = std::__cxx11::string::compare((char *)this_00), iVar1 != 0)) &&
                           (iVar1 = std::__cxx11::string::compare((char *)this_00), iVar1 != 0)) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e0,"Error in ",9);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e0,"void foxxll::disk_config::parse_fileio()"
                                     ,0x28);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e0," : ",3);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e0,"Parameter \'",0xb);
                          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                             ((ostream *)local_1e0,(str->_M_dataplus)._M_p,
                                              str->_M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar4,"\' invalid for fileio \'",0x16);
                          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                             (poVar4,(this->io_impl)._M_dataplus._M_p,
                                              (this->io_impl)._M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar4,"\' in disk configuration file.",0x1d);
                          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::__cxx11::stringbuf::str();
                          std::runtime_error::runtime_error(prVar5,local_220);
                          __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        this->unlink_on_open = true;
                      }
                    }
                  }
                }
              }
            }
          }
        }
LAB_0014601b:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_200);
        str = str + 1;
      } while (str != local_68.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void disk_config::parse_fileio()
{
    // skip over leading spaces
    size_t leadspace = io_impl.find_first_not_of(' ');
    if (leadspace > 0)
        io_impl = io_impl.substr(leadspace);

    // split off extra fileio parameters
    size_t spacepos = io_impl.find(' ');
    if (spacepos == std::string::npos)
        return; // no space in fileio

    // *** Parse Extra Fileio Parameters ***

    std::string paramstr = io_impl.substr(spacepos + 1);
    io_impl = io_impl.substr(0, spacepos);

    std::vector<std::string> param = tlx::split(' ', paramstr);

    for (std::vector<std::string>::const_iterator p = param.begin();
         p != param.end(); ++p)
    {
        // split at equal sign
        std::vector<std::string> eq = tlx::split('=', *p, 2, 2);

        // *** PLEASE try to keep the elseifs sorted by parameter name!
        if (*p == "") {
            // skip blank options
        }
        else if (*p == "autogrow" || *p == "noautogrow" || eq[0] == "autogrow")
        {
            // TODO: which fileio implementation support autogrow?

            if (*p == "autogrow") autogrow = true;
            else if (*p == "noautogrow") autogrow = false;
            else if (eq[1] == "off") autogrow = false;
            else if (eq[1] == "on") autogrow = true;
            else if (eq[1] == "no") autogrow = false;
            else if (eq[1] == "yes") autogrow = true;
            else
            {
                FOXXLL_THROW(
                    std::runtime_error,
                    "Invalid parameter '" << *p << "' in disk configuration file."
                );
            }
        }
        else if (*p == "delete" || *p == "delete_on_exit")
        {
            delete_on_exit = true;
        }
        else if (*p == "direct" || *p == "nodirect" || eq[0] == "direct")
        {
            // io_impl is not checked here, but I guess that is okay for DIRECT
            // since it depends highly platform _and_ build-time configuration.

            if (*p == "direct") direct = DIRECT_ON;          // force ON
            else if (*p == "nodirect") direct = DIRECT_OFF;  // force OFF
            else if (eq[1] == "off") direct = DIRECT_OFF;
            else if (eq[1] == "try") direct = DIRECT_TRY;
            else if (eq[1] == "on") direct = DIRECT_ON;
            else if (eq[1] == "no") direct = DIRECT_OFF;
            else if (eq[1] == "yes") direct = DIRECT_ON;
            else
            {
                FOXXLL_THROW(
                    std::runtime_error,
                    "Invalid parameter '" << *p << "' in disk configuration file."
                );
            }
        }
        else if (eq[0] == "queue")
        {
            if (io_impl == "linuxaio") {
                FOXXLL_THROW(std::runtime_error, "Parameter '" << *p << "' invalid for fileio '" << io_impl << "' in disk configuration file.");
            }

            char* endp;
            queue = static_cast<int>(strtoul(eq[1].c_str(), &endp, 10));
            if (endp && *endp != 0) {
                FOXXLL_THROW(
                    std::runtime_error,
                    "Invalid parameter '" << *p << "' in disk configuration file."
                );
            }
        }
        else if (eq[0] == "queue_length")
        {
            if (io_impl != "linuxaio") {
                FOXXLL_THROW(
                    std::runtime_error, "Parameter '" << *p << "' "
                        "is only valid for fileio linuxaio "
                        "in disk configuration file."
                );
            }

            char* endp;
            queue_length = static_cast<int>(strtoul(eq[1].c_str(), &endp, 10));
            if (endp && *endp != 0) {
                FOXXLL_THROW(
                    std::runtime_error,
                    "Invalid parameter '" << *p << "' in disk configuration file."
                );
            }
        }
        else if (eq[0] == "device_id" || eq[0] == "devid")
        {
            char* endp;
            device_id = static_cast<int>(strtoul(eq[1].c_str(), &endp, 10));
            if (endp && *endp != 0) {
                FOXXLL_THROW(
                    std::runtime_error,
                    "Invalid parameter '" << *p << "' in disk configuration file."
                );
            }
        }
        else if (*p == "raw_device")
        {
            if (!(io_impl == "syscall")) {
                FOXXLL_THROW(std::runtime_error, "Parameter '" << *p << "' invalid for fileio '" << io_impl << "' in disk configuration file.");
            }

            raw_device = true;
        }
        else if (*p == "unlink" || *p == "unlink_on_open")
        {
            if (!(io_impl == "syscall" || io_impl == "linuxaio" ||
                  io_impl == "mmap"))
            {
                FOXXLL_THROW(std::runtime_error, "Parameter '" << *p << "' invalid for fileio '" << io_impl << "' in disk configuration file.");
            }

            unlink_on_open = true;
        }
        else
        {
            FOXXLL_THROW(
                std::runtime_error,
                "Invalid optional parameter '" << *p << "' in disk configuration file."
            );
        }
    }
}